

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O3

Dar_Lib_t * Dar_LibAlloc(int nObjs)

{
  ulong *puVar1;
  Dar_Lib_t *pDVar2;
  Dar_LibObj_t *pDVar3;
  char **ppcVar4;
  long lVar5;
  
  pDVar2 = (Dar_Lib_t *)calloc(1,0x3f18);
  pDVar2->nObjs = nObjs;
  pDVar3 = (Dar_LibObj_t *)calloc(1,(long)nObjs << 3);
  pDVar2->pObjs = pDVar3;
  ppcVar4 = Dar_Permutations(4);
  pDVar2->pPerms4 = ppcVar4;
  Dar_Truth4VarNPN(&pDVar2->puCanons,&pDVar2->pPhases,&pDVar2->pPerms,&pDVar2->pMap);
  pDVar2->iObj = 4;
  lVar5 = 0;
  do {
    puVar1 = (ulong *)(&pDVar2->pObjs->field_0x0 + lVar5 * 2);
    *puVar1 = *puVar1 | 0x800000000;
    *(ulong *)(&pDVar2->pObjs->field_0x0 + lVar5 * 2) =
         *(ulong *)(&pDVar2->pObjs->field_0x0 + lVar5 * 2) & 0xfffffffff |
         (ulong)*(uint *)((long)&Saig_ManBmcCof1_s_Truth + lVar5) << 0x24;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x10);
  return pDVar2;
}

Assistant:

Dar_Lib_t * Dar_LibAlloc( int nObjs )
{
    unsigned uTruths[4] = { 0xAAAA, 0xCCCC, 0xF0F0, 0xFF00 };
    Dar_Lib_t * p;
    int i;//, clk = Abc_Clock();
    p = ABC_ALLOC( Dar_Lib_t, 1 );
    memset( p, 0, sizeof(Dar_Lib_t) );
    // allocate objects
    p->nObjs = nObjs;
    p->pObjs = ABC_ALLOC( Dar_LibObj_t, nObjs );
    memset( p->pObjs, 0, sizeof(Dar_LibObj_t) * nObjs );
    // allocate canonical data
    p->pPerms4 = Dar_Permutations( 4 );
    Dar_Truth4VarNPN( &p->puCanons, &p->pPhases, &p->pPerms, &p->pMap );
    // start the elementary objects
    p->iObj = 4;
    for ( i = 0; i < 4; i++ )
    {
        p->pObjs[i].fTerm = 1;
        p->pObjs[i].Num = uTruths[i];
    }
//    ABC_PRT( "Library start", Abc_Clock() - clk );
    return p;
}